

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeKRMmatricesGlobal
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor
          )

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  PointerType pdVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar22 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar23 [64];
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict2 ScaledMassMatrix;
  long local_9f0;
  long local_9e8;
  long local_9e0;
  double adStack_9c0 [4];
  double adStack_9a0 [302];
  
  auVar23._8_56_ = in_register_00001248;
  auVar23._0_8_ = Rfactor;
  auVar22._8_56_ = in_register_00001208;
  auVar22._0_8_ = Kfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0x48) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0x48)) {
    __assert_fail("(H.rows() == 3 * NSF) && (H.cols() == 3 * NSF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3833.cpp"
                  ,0x1f5,
                  "virtual void chrono::fea::ChElementShellANCF_3833::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if (this->m_method == ContInt) {
    auVar20._8_8_ = 0x8000000000000000;
    auVar20._0_8_ = 0x8000000000000000;
    auVar20 = vxorpd_avx512vl(auVar22._0_16_,auVar20);
    if (this->m_damping_enabled == true) {
      auVar21._8_8_ = 0x8000000000000000;
      auVar21._0_8_ = 0x8000000000000000;
      auVar21 = vxorpd_avx512vl(auVar23._0_16_,auVar21);
      ComputeInternalJacobianContIntDamping(this,H,auVar20._0_8_,auVar21._0_8_);
    }
    else {
      ComputeInternalJacobianContIntNoDamping(this,H,auVar20._0_8_);
    }
  }
  else {
    ComputeInternalJacobianPreInt(this,H,Kfactor,Rfactor);
  }
  uVar15 = 0xfffffffffffffffc;
  do {
    pdVar6 = (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
             m_storage.m_data.array + uVar15 + 4;
    dVar7 = pdVar6[1];
    dVar12 = pdVar6[2];
    dVar13 = pdVar6[3];
    adStack_9a0[uVar15] = Mfactor * *pdVar6;
    adStack_9a0[uVar15 + 1] = Mfactor * dVar7;
    adStack_9a0[uVar15 + 2] = Mfactor * dVar12;
    adStack_9a0[uVar15 + 3] = Mfactor * dVar13;
    uVar15 = uVar15 + 4;
  } while (uVar15 < 0x128);
  local_9f0 = 0x10;
  local_9e8 = 8;
  local_9e0 = 0;
  lVar18 = 0;
  lVar17 = 0;
  uVar15 = 0;
  do {
    lVar2 = lVar17 * 3 + 1;
    lVar3 = lVar17 * 3 + 2;
    uVar15 = uVar15 & 0xffffffff;
    uVar16 = 300;
    if (300 < uVar15) {
      uVar16 = uVar15;
    }
    lVar19 = 0;
    do {
      if (uVar16 == uVar15) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 300, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 300, 1>, Level = 1]"
                     );
      }
      lVar8 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      if (lVar8 <= lVar17 * 3) {
LAB_00765575:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                     );
      }
      lVar1 = lVar18 + lVar19;
      lVar9 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value;
      if (lVar9 <= lVar1) goto LAB_00765575;
      dVar7 = adStack_9c0[uVar15];
      pdVar10 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      lVar11 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
      lVar4 = local_9e0 * lVar11 + local_9e0;
      *(double *)((long)pdVar10 + lVar19 * 8 + lVar4) =
           dVar7 + *(double *)((long)pdVar10 + lVar19 * 8 + lVar4);
      if ((((lVar8 <= lVar2) || (lVar4 = lVar18 + 1 + lVar19, lVar9 <= lVar4)) ||
          (lVar5 = local_9e8 * lVar11 + local_9e0,
          *(double *)((long)pdVar10 + lVar19 * 8 + lVar5 + 8) =
               dVar7 + *(double *)((long)pdVar10 + lVar19 * 8 + lVar5 + 8), lVar8 <= lVar3)) ||
         (lVar5 = lVar18 + 2 + lVar19, lVar9 <= lVar5)) goto LAB_00765575;
      lVar14 = local_9f0 * lVar11 + local_9e0;
      *(double *)((long)pdVar10 + lVar19 * 8 + lVar14 + 0x10) =
           dVar7 + *(double *)((long)pdVar10 + lVar19 * 8 + lVar14 + 0x10);
      if (lVar19 != 0) {
        if (((lVar8 <= lVar1) || (lVar9 <= lVar17 * 3)) ||
           ((pdVar10[lVar17 * 3 + lVar1 * lVar11] = dVar7 + pdVar10[lVar17 * 3 + lVar1 * lVar11],
            lVar8 <= lVar4 || (lVar9 <= lVar2)))) goto LAB_00765575;
        pdVar10[lVar2 + lVar4 * lVar11] = dVar7 + pdVar10[lVar2 + lVar4 * lVar11];
        if ((lVar8 <= lVar5) || (lVar9 <= lVar3)) goto LAB_00765575;
        pdVar10[lVar3 + lVar11 * lVar5] = dVar7 + pdVar10[lVar3 + lVar11 * lVar5];
      }
      uVar15 = uVar15 + 1;
      lVar8 = lVar18 + 3 + lVar19;
      lVar19 = lVar19 + 3;
    } while (lVar8 != 0x48);
    lVar17 = lVar17 + 1;
    lVar18 = lVar18 + 3;
    local_9f0 = local_9f0 + 0x18;
    local_9e0 = local_9e0 + 0x18;
    local_9e8 = local_9e8 + 0x18;
    if (lVar17 == 0x18) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementShellANCF_3833::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 3 * NSF) && (H.cols() == 3 * NSF));

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalJacobianContIntDamping(H, -Kfactor, -Rfactor);
        } else {
            ComputeInternalJacobianContIntNoDamping(H, -Kfactor);
        }
    } else {
        ComputeInternalJacobianPreInt(H, Kfactor, Rfactor);
    }

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            H(3 * i, 3 * j) += ScaledMassMatrix(idx);
            H(3 * i + 1, 3 * j + 1) += ScaledMassMatrix(idx);
            H(3 * i + 2, 3 * j + 2) += ScaledMassMatrix(idx);
            if (i != j) {
                H(3 * j, 3 * i) += ScaledMassMatrix(idx);
                H(3 * j + 1, 3 * i + 1) += ScaledMassMatrix(idx);
                H(3 * j + 2, 3 * i + 2) += ScaledMassMatrix(idx);
            }
            idx++;
        }
    }
}